

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O2

void __thiscall GLDrawList::Reset(GLDrawList *this)

{
  if (this->sorted != (SortNode *)0x0) {
    SortNodes.usecount = this->SortNodeStart;
  }
  this->sorted = (SortNode *)0x0;
  TArray<GLWall,_GLWall>::Clear(&this->walls);
  TArray<GLFlat,_GLFlat>::Clear(&this->flats);
  TArray<GLSprite,_GLSprite>::Clear(&this->sprites);
  TArray<GLDrawItem,_GLDrawItem>::Clear(&this->drawitems);
  return;
}

Assistant:

void GLDrawList::Reset()
{
	if (sorted) SortNodes.Release(SortNodeStart);
	sorted=NULL;
	walls.Clear();
	flats.Clear();
	sprites.Clear();
	drawitems.Clear();
}